

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void ra_left(ASMState *as,Reg dest,IRRef lref)

{
  IRIns *ir_00;
  RegSet allow;
  Reg local_24;
  Reg left;
  IRIns *ir;
  IRRef lref_local;
  Reg dest_local;
  ASMState *as_local;
  
  ir_00 = as->ir + lref;
  local_24 = (Reg)(ir_00->field_1).r;
  if (((ir_00->field_1).r & 0x80) != 0) {
    if (lref < 0x8000) {
      if ((ir_00->field_1).o == '\x1c') {
        if ((ir_00[1] == (IRIns)0x0) || ((as->freeset & 0xffff0000) == 0)) {
          emit_loadk64(as,dest,ir_00);
          return;
        }
      }
      else {
        if ((ir_00->field_1).o == '\x1d') {
          emit_loadk64(as,dest,ir_00);
          return;
        }
        if ((((ir_00->field_1).o == '\x18') || ((ir_00->field_1).o == '\x19')) ||
           ((ir_00->field_1).o == '\x1a')) {
          emit_loadk64(as,dest,ir_00);
          return;
        }
        if ((ir_00->field_1).o != '\x16') {
          emit_loadi(as,dest,ir_00->i);
          return;
        }
      }
    }
    if ((0xfc < local_24) && (as->sectref <= lref)) {
      (ir_00->field_1).r = (byte)dest | 0x80;
    }
    allow = 0xffff0000;
    if (dest < 0x10) {
      allow = 0xbfef;
    }
    local_24 = ra_allocref(as,lref,allow);
  }
  as->weakset = (1 << ((byte)local_24 & 0x1f) ^ 0xffffffffU) & as->weakset;
  if (dest != local_24) {
    if ((((ir_00->field_1).t.irt & 0x40) == 0) || (as->phireg[dest] != lref)) {
      emit_movrr(as,ir_00,dest,local_24);
    }
    else {
      as->modset = 1 << ((byte)local_24 & 0x1f) | as->modset;
      ra_rename(as,local_24,dest);
    }
  }
  return;
}

Assistant:

static void ra_left(ASMState *as, Reg dest, IRRef lref)
{
  IRIns *ir = IR(lref);
  Reg left = ir->r;
  if (ra_noreg(left)) {
    if (irref_isk(lref)) {
      if (ir->o == IR_KNUM) {
	/* FP remat needs a load except for +0. Still better than eviction. */
	if (tvispzero(ir_knum(ir)) || !(as->freeset & RSET_FPR)) {
	  emit_loadk64(as, dest, ir);
	  return;
	}
#if LJ_64
      } else if (ir->o == IR_KINT64) {
	emit_loadk64(as, dest, ir);
	return;
#if LJ_GC64
      } else if (ir->o == IR_KGC || ir->o == IR_KPTR || ir->o == IR_KKPTR) {
	emit_loadk64(as, dest, ir);
	return;
#endif
#endif
      } else if (ir->o != IR_KPRI) {
	lj_assertA(ir->o == IR_KINT || ir->o == IR_KGC ||
		   ir->o == IR_KPTR || ir->o == IR_KKPTR || ir->o == IR_KNULL,
		   "K%03d has bad IR op %d", REF_BIAS - lref, ir->o);
	emit_loadi(as, dest, ir->i);
	return;
      }
    }
    if (!ra_hashint(left) && !iscrossref(as, lref))
      ra_sethint(ir->r, dest);  /* Propagate register hint. */
    left = ra_allocref(as, lref, dest < RID_MAX_GPR ? RSET_GPR : RSET_FPR);
  }
  ra_noweak(as, left);
  /* Move needed for true 3-operand instruction: y=a+b ==> y=a; y+=b. */
  if (dest != left) {
    /* Use register renaming if dest is the PHI reg. */
    if (irt_isphi(ir->t) && as->phireg[dest] == lref) {
      ra_modified(as, left);
      ra_rename(as, left, dest);
    } else {
      emit_movrr(as, ir, dest, left);
    }
  }
}